

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::BinaryLambdaWrapper,bool,duckdb::string_t(*)(duckdb::string_t,duckdb::string_t),false,true>
               (string_t *ldata,string_t *rdata,string_t *result_data,idx_t count,ValidityMask *mask
               ,_func_string_t_string_t_string_t *fun)

{
  unsigned_long *puVar1;
  anon_struct_16_3_d7536bce_for_pointer aVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  string_t sVar11;
  string_t sVar12;
  string_t sVar13;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      aVar2 = (rdata->value).pointer;
      lVar7 = 8;
      do {
        sVar11.value.pointer.ptr = (char *)*(undefined8 *)((long)&ldata->value + lVar7);
        sVar11.value._0_8_ = *(undefined8 *)((long)ldata + lVar7 + -8);
        sVar11 = (*fun)(sVar11,(string_t)aVar2);
        *(long *)((long)result_data + lVar7 + -8) = sVar11.value._0_8_;
        *(long *)((long)&result_data->value + lVar7) = sVar11.value._8_8_;
        lVar7 = lVar7 + 0x10;
        count = count - 1;
      } while (count != 0);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar6 = 0;
    uVar4 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar9 = uVar6 + 0x40;
        if (count <= uVar6 + 0x40) {
          uVar9 = count;
        }
LAB_002d52e6:
        uVar3 = uVar6;
        if (uVar6 < uVar9) {
          aVar2 = (rdata->value).pointer;
          uVar10 = uVar6 << 4 | 8;
          do {
            sVar13.value.pointer.ptr = (char *)*(undefined8 *)((long)&ldata->value + uVar10);
            sVar13.value._0_8_ = *(undefined8 *)((long)ldata + (uVar10 - 8));
            sVar11 = (*fun)(sVar13,(string_t)aVar2);
            *(long *)((long)result_data + (uVar10 - 8)) = sVar11.value._0_8_;
            *(long *)((long)&result_data->value + uVar10) = sVar11.value._8_8_;
            uVar6 = uVar6 + 1;
            uVar10 = uVar10 + 0x10;
            uVar3 = uVar9;
          } while (uVar9 != uVar6);
        }
      }
      else {
        uVar10 = puVar1[uVar4];
        uVar9 = uVar6 + 0x40;
        if (count <= uVar6 + 0x40) {
          uVar9 = count;
        }
        uVar3 = uVar9;
        if (uVar10 != 0) {
          if (uVar10 == 0xffffffffffffffff) goto LAB_002d52e6;
          uVar3 = uVar6;
          if (uVar6 < uVar9) {
            uVar5 = uVar6 << 4 | 8;
            uVar8 = 0;
            do {
              if ((uVar10 >> (uVar8 & 0x3f) & 1) != 0) {
                sVar12.value.pointer.ptr = (char *)*(undefined8 *)((long)&ldata->value + uVar5);
                sVar12.value._0_8_ = *(undefined8 *)((long)ldata + (uVar5 - 8));
                sVar11 = (*fun)(sVar12,(string_t)(rdata->value).pointer);
                *(long *)((long)result_data + (uVar5 - 8)) = sVar11.value._0_8_;
                *(long *)((long)&result_data->value + uVar5) = sVar11.value._8_8_;
              }
              uVar8 = uVar8 + 1;
              uVar5 = uVar5 + 0x10;
              uVar3 = uVar9;
            } while (uVar9 - uVar6 != uVar8);
          }
        }
      }
      uVar6 = uVar3;
      uVar4 = uVar4 + 1;
    } while (uVar4 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}